

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O1

Polygon * __thiscall Polygon::ConvexHull(Polygon *__return_storage_ptr__,Polygon *this)

{
  size_t *psVar1;
  float fVar2;
  _List_node_base *p_Var3;
  float fVar4;
  float fVar5;
  const_iterator __begin1;
  _List_node_base *p_Var6;
  _Self __tmp;
  _List_node_base *p_Var7;
  const_iterator __end1;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float local_28;
  float local_24;
  
  if ((this->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl._M_node._M_size < 3) {
    (__return_storage_ptr__->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl.
    _M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    (__return_storage_ptr__->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl.
    _M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    (__return_storage_ptr__->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl.
    _M_node._M_size = 0;
    (__return_storage_ptr__->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl.
    _M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
    (__return_storage_ptr__->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl.
    _M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  }
  else {
    p_Var6 = (this->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl._M_node.
             super__List_node_base._M_next;
    fVar9 = *(float *)((long)(p_Var6 + 1) + 4);
    fVar5 = *(float *)(p_Var6 + 1);
    for (; p_Var6 != (_List_node_base *)this;
        p_Var6 = (((list<Point,_std::allocator<Point>_> *)&p_Var6->_M_next)->
                 super__List_base<Point,_std::allocator<Point>_>)._M_impl._M_node.
                 super__List_node_base._M_next) {
      fVar12 = *(float *)&((list<Point,_std::allocator<Point>_> *)(p_Var6 + 1))->
                          super__List_base<Point,_std::allocator<Point>_>;
      fVar4 = fVar12;
      if (fVar5 <= fVar12) {
        fVar4 = fVar5;
      }
      fVar9 = (float)(~-(uint)(fVar12 < fVar5) & (uint)fVar9 |
                     *(uint *)((long)(p_Var6 + 1) + 4) & -(uint)(fVar12 < fVar5));
      fVar5 = fVar4;
    }
    (__return_storage_ptr__->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl.
    _M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
    (__return_storage_ptr__->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl.
    _M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
    (__return_storage_ptr__->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl.
    _M_node._M_size = 0;
    local_28 = fVar5;
    local_24 = fVar9;
    do {
      p_Var6 = (_List_node_base *)operator_new(0x18);
      *(float *)&p_Var6[1]._M_next = local_28;
      *(float *)((long)&p_Var6[1]._M_next + 4) = local_24;
      std::__detail::_List_node_base::_M_hook(p_Var6);
      psVar1 = &(__return_storage_ptr__->mPoints).super__List_base<Point,_std::allocator<Point>_>.
                _M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      p_Var6 = (this->mPoints).super__List_base<Point,_std::allocator<Point>_>._M_impl._M_node.
               super__List_node_base._M_next;
      for (p_Var3 = p_Var6; p_Var3 != (_List_node_base *)this;
          p_Var3 = (((list<Point,_std::allocator<Point>_> *)&p_Var3->_M_next)->
                   super__List_base<Point,_std::allocator<Point>_>)._M_impl._M_node.
                   super__List_node_base._M_next) {
        if ((*(float *)&((list<Point,_std::allocator<Point>_> *)(p_Var3 + 1))->
                        super__List_base<Point,_std::allocator<Point>_> == local_28) &&
           (!NAN(*(float *)&((list<Point,_std::allocator<Point>_> *)(p_Var3 + 1))->
                            super__List_base<Point,_std::allocator<Point>_>) && !NAN(local_28))) {
          if ((*(float *)((long)(p_Var3 + 1) + 4) == local_24) &&
             (!NAN(*(float *)((long)(p_Var3 + 1) + 4)) && !NAN(local_24))) break;
        }
      }
      p_Var7 = p_Var3->_M_next;
      if (p_Var3->_M_next == (_List_node_base *)this) {
        p_Var7 = p_Var6;
      }
      fVar12 = *(float *)((long)(p_Var7 + 1) + 4);
      fVar4 = *(float *)(p_Var7 + 1);
      for (; p_Var6 != (_List_node_base *)this; p_Var6 = p_Var6->_M_next) {
        fVar10 = *(float *)(p_Var6 + 1);
        fVar2 = *(float *)((long)(p_Var6 + 1) + 4);
        fVar11 = (fVar4 - fVar10) * (fVar2 - local_24) - (fVar12 - fVar2) * (fVar10 - local_28);
        if (0.0 <= fVar11) {
          fVar10 = fVar4;
        }
        uVar8 = -(uint)(fVar11 < 0.0);
        fVar12 = (float)(~uVar8 & (uint)fVar12 | (uint)fVar2 & uVar8);
        fVar4 = fVar10;
      }
      local_28 = fVar4;
      local_24 = fVar12;
    } while ((((fVar4 != fVar5) || (NAN(fVar4) || NAN(fVar5))) || (fVar12 != fVar9)) ||
            (NAN(fVar12) || NAN(fVar9)));
  }
  return __return_storage_ptr__;
}

Assistant:

Polygon Polygon::ConvexHull() const
{
    // Gift-wrapping algorithm
    if(mPoints.size() < 3)
    {
        return Polygon();
    }
    Point leftmostPoint = mPoints.front();
    for(auto point : mPoints)
    {
        if(point.IsOnTheLeftOf(leftmostPoint))
        {
            leftmostPoint = point;
        }
    }
    Polygon convexHull;
    Point currentHullPoint = leftmostPoint;
    do
    {
        Point nextHullPoint;
        convexHull.mPoints.push_back(currentHullPoint);
        auto NextHullPointIt = std::find(mPoints.begin(), mPoints.end(), currentHullPoint);
        NextHullPointIt++;
        if(NextHullPointIt != mPoints.end())
        {
            nextHullPoint = *(NextHullPointIt);
        }
        else
        {
            nextHullPoint = mPoints.front();
        }
        for(auto candidateHullPoint : mPoints)
        {
            if(candidateHullPoint.IsOnTheLeftOf(currentHullPoint, nextHullPoint))
            {
                nextHullPoint = candidateHullPoint;
            }
        }
        currentHullPoint = nextHullPoint;
    } while(currentHullPoint != leftmostPoint);
    return convexHull;
}